

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Builder.cpp
# Opt level: O1

Slice __thiscall arangodb::velocypack::Builder::getKey(Builder *this,string_view key)

{
  pointer pCVar1;
  ValueLength VVar2;
  pointer puVar3;
  string_view attribute;
  byte *pbVar4;
  bool bVar5;
  ulong uVar6;
  Exception *this_00;
  pointer puVar7;
  byte *unaff_RBP;
  Slice s;
  byte *local_50;
  size_t local_48;
  char *local_40;
  uint8_t *local_38;
  
  local_40 = key._M_str;
  local_48 = key._M_len;
  pCVar1 = (this->_stack).
           super__Vector_base<arangodb::velocypack::Builder::CompoundInfo,_arangodb::velocypack::short_alloc<arangodb::velocypack::Builder::CompoundInfo,_64UL,_8UL>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if ((this->_stack).
      super__Vector_base<arangodb::velocypack::Builder::CompoundInfo,_arangodb::velocypack::short_alloc<arangodb::velocypack::Builder::CompoundInfo,_64UL,_8UL>_>
      ._M_impl.super__Vector_impl_data._M_start == pCVar1) {
    getKey();
  }
  else {
    VVar2 = pCVar1[-1].startPos;
    if ((this->_start[VVar2] == '\v') || (this->_start[VVar2] == '\x14')) {
      puVar7 = (this->_indexes).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
               _M_impl.super__Vector_impl_data._M_start + pCVar1[-1].indexStartPos;
      puVar3 = (this->_indexes).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      do {
        if (puVar7 == puVar3) {
          return (Slice)"";
        }
        local_50 = this->_start + *puVar7 + VVar2;
        local_38 = (uint8_t *)
                   SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::makeKey
                             ((SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *
                              )&local_50);
        attribute._M_str = local_40;
        attribute._M_len = local_48;
        bVar5 = SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::isEqualString
                          ((SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *)
                           &local_38,attribute);
        pbVar4 = local_50;
        if (bVar5) {
          uVar6 = (ulong)"\x01\x01"[*local_50];
          if (uVar6 == 0) {
            uVar6 = SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::
                    byteSizeDynamic((SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>
                                     *)&local_50,local_50);
          }
          unaff_RBP = pbVar4 + uVar6;
        }
        else {
          puVar7 = puVar7 + 1;
        }
      } while (!bVar5);
      return (Slice)unaff_RBP;
    }
  }
  this_00 = (Exception *)__cxa_allocate_exception(0x18);
  Exception::Exception(this_00,BuilderNeedOpenObject);
  __cxa_throw(this_00,&Exception::typeinfo,Exception::~Exception);
}

Assistant:

Slice Builder::getKey(std::string_view key) const {
  if (VELOCYPACK_UNLIKELY(_stack.empty())) {
    throw Exception(Exception::BuilderNeedOpenObject);
  }
  VELOCYPACK_ASSERT(!_stack.empty());
  ValueLength const pos = _stack.back().startPos;
  ValueLength const indexStartPos = _stack.back().indexStartPos;
  if (VELOCYPACK_UNLIKELY(_start[pos] != 0x0b && _start[pos] != 0x14)) {
    throw Exception(Exception::BuilderNeedOpenObject);
  }
  std::vector<ValueLength>::const_iterator indexStart =
      _indexes.begin() + indexStartPos;
  std::vector<ValueLength>::const_iterator indexEnd = _indexes.end();
  while (indexStart != indexEnd) {
    Slice s(_start + pos + *indexStart);
    if (s.makeKey().isEqualString(key)) {
      return Slice(s.start() + s.byteSize());
    }
    ++indexStart;
  }
  return Slice();
}